

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_handler.cpp
# Opt level: O2

bool __thiscall
duckdb::PragmaHandler::HandlePragma
          (PragmaHandler *this,SQLStatement *statement,string *resulting_query)

{
  pragma_query_t p_Var1;
  PragmaStatement *pPVar2;
  Binder *info;
  QueryErrorContext error_context;
  pointer pBVar3;
  unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true> bound_info
  ;
  shared_ptr<duckdb::Binder,_true> binder;
  FunctionParameters parameters;
  undefined1 auStack_b8 [16];
  undefined1 local_a8 [24];
  FunctionParameters local_90;
  string local_40;
  
  pPVar2 = SQLStatement::Cast<duckdb::PragmaStatement>(statement);
  unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>::operator->
            (&pPVar2->info);
  PragmaInfo::Copy((PragmaInfo *)(auStack_b8 + 8));
  optional_idx::optional_idx((optional_idx *)(local_a8 + 0x10),statement->stmt_location);
  Binder::CreateBinder
            ((Binder *)local_a8,this->context,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER
            );
  info = shared_ptr<duckdb::Binder,_true>::operator->((shared_ptr<duckdb::Binder,_true> *)local_a8);
  error_context.query_location.index =
       (optional_idx)
       unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>::operator*
                 ((unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true> *)
                  (auStack_b8 + 8));
  Binder::BindPragma((Binder *)auStack_b8,(PragmaInfo *)info,error_context);
  pBVar3 = unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>::
           operator->((unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>
                       *)auStack_b8);
  p_Var1 = (pBVar3->function).query;
  if (p_Var1 != (pragma_query_t)0x0) {
    pBVar3 = unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>
             ::operator->((unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>
                           *)auStack_b8);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)(local_a8 + 0x18),
               &(pBVar3->parameters).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
    pBVar3 = unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>
             ::operator->((unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>
                           *)auStack_b8);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable(&local_90.named_parameters._M_h,&(pBVar3->named_parameters)._M_h);
    pBVar3 = unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>
             ::operator->((unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>
                           *)auStack_b8);
    (*(pBVar3->function).query)(&local_40,this->context,(FunctionParameters *)(local_a8 + 0x18));
    ::std::__cxx11::string::operator=((string *)resulting_query,(string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    FunctionParameters::~FunctionParameters((FunctionParameters *)(local_a8 + 0x18));
  }
  ::std::unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>_>::
  ~unique_ptr((unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>_> *)
              auStack_b8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)auStack_b8._8_8_)[1])();
  }
  return p_Var1 != (pragma_query_t)0x0;
}

Assistant:

bool PragmaHandler::HandlePragma(SQLStatement &statement, string &resulting_query) {
	auto info = statement.Cast<PragmaStatement>().info->Copy();
	QueryErrorContext error_context(statement.stmt_location);
	auto binder = Binder::CreateBinder(context);
	auto bound_info = binder->BindPragma(*info, error_context);
	if (bound_info->function.query) {
		FunctionParameters parameters {bound_info->parameters, bound_info->named_parameters};
		resulting_query = bound_info->function.query(context, parameters);
		return true;
	}
	return false;
}